

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jason.c
# Opt level: O2

void StartUntil(void)

{
  int iVar1;
  tokentype tokopnd;
  addressrec a;
  addressrec b;
  optype intopcode;
  
  iVar1 = actionpop();
  tokopnd = actionpop();
  a = getaddress(tokopnd);
  if (iVar1 - 0x19U < 7) {
    intopcode = *(optype *)(&DAT_0010bb90 + (ulong)(iVar1 - 0x19U) * 4);
  }
  else {
    intopcode = opmult;
  }
  b = gettemplabel();
  nextop = genquad(intopcode,a,b,(addressrec)0x4);
  actionpush(b.opnd);
  return;
}

Assistant:

void	StartUntil(void)
{
    enum tokentype		relop;
    enum operandtype	otype = opnnull;
    struct addressrec	addr2, op;
    relop = actionpop();
    op = getaddress(actionpop());
    switch(relop)	{
        case tokgreater:	otype = (enum operandtype)opifposjump; break;
        case tokless:		otype = (enum operandtype)opifnegjump; break;
        case tokequals:		otype = (enum operandtype)opifzjump; break;
        case toknotequal:	otype = (enum operandtype)opifnzjump; break;
        default: break;
    }
    
    addr2 = gettemplabel();
    nextop = genquad((enum optype)otype, op, addr2, no_op);
    actionpush(addr2.opnd);
    
}